

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffcdfl(fitsfile *fptr,int *status)

{
  int iVar1;
  FITSfile *pFVar2;
  long bytepos;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  ulong nbytes;
  char chbuff [2880];
  char local_b58 [2880];
  
  if (0 < *status) {
    return *status;
  }
  pFVar2 = fptr->Fptr;
  if (fptr->HDUposition != pFVar2->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar2 = fptr->Fptr;
  }
  if (pFVar2->heapstart != 0) {
    bytepos = pFVar2->heapstart + pFVar2->datastart + pFVar2->heapsize;
    lVar5 = (bytepos + 0xb3f) % 0xb40 + -0xb3f;
    if (lVar5 != 0) {
      nbytes = -lVar5;
      ffmbyt(fptr,bytepos,0,status);
      iVar1 = ffgbyt(fptr,nbytes,local_b58,status);
      if (iVar1 < 1) {
        pFVar2 = fptr->Fptr;
        uVar3 = 0;
        do {
          if ((nbytes & 0xffffffff) == uVar3) goto LAB_0014a65b;
          pcVar4 = local_b58 + uVar3;
          uVar3 = uVar3 + 1;
        } while ((uint)(pFVar2->hdutype == 1) << 5 == (int)*pcVar4);
        *status = 0xff;
        pcVar4 = "Warning: remaining bytes following data are not filled with zeros.";
        if (pFVar2->hdutype == 1) {
          pcVar4 = "Warning: remaining bytes following ASCII table data are not filled with blanks."
          ;
        }
      }
      else {
        pcVar4 = "Error reading data unit fill bytes (ffcdfl).";
      }
      ffpmsg(pcVar4);
    }
  }
LAB_0014a65b:
  return *status;
}

Assistant:

int ffcdfl( fitsfile *fptr, int *status)
{
   int nfill,i;
   LONGLONG filpos;
   char chfill,chbuff[2880];

   if( *status > 0 ) return( *status );

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

   /*   check if the data unit is null   */
   if( (fptr->Fptr)->heapstart==0 ) return( *status );

   /* calculate starting position of the fill bytes, if any */
   filpos = (fptr->Fptr)->datastart 
          + (fptr->Fptr)->heapstart 
          + (fptr->Fptr)->heapsize;

   /*   calculate the number of fill bytes   */
   nfill = (long) ((filpos + 2879) / 2880 * 2880 - filpos);
   if( nfill == 0 ) return( *status );

   /*   move to the beginning of the fill bytes   */
   ffmbyt(fptr, filpos, FALSE, status);

   if( ffgbyt(fptr, nfill, chbuff, status) > 0)
   {
      ffpmsg("Error reading data unit fill bytes (ffcdfl).");
      return( *status );
   }

   if( (fptr->Fptr)->hdutype==ASCII_TBL )
      chfill = 32;         /* ASCII tables are filled with spaces */
   else
      chfill = 0;          /* all other extensions are filled with zeros */
   
   /*   check for all zeros or blanks   */
   
   for(i=0;i<nfill;i++) {
      if( chbuff[i] != chfill ) {
         *status=BAD_DATA_FILL;
         if( (fptr->Fptr)->hdutype==ASCII_TBL )
            ffpmsg("Warning: remaining bytes following ASCII table data are not filled with blanks.");
         else
            ffpmsg("Warning: remaining bytes following data are not filled with zeros.");
         return( *status );
      }
   }
   return( *status );
}